

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  ushort uVar1;
  int flags;
  Mem *pMem_local;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x12) == 0) {
        pMem_local = (Mem *)0x0;
      }
      else {
        pMem_local = (Mem *)memIntValue(pMem);
      }
    }
    else {
      pMem_local = (Mem *)doubleToInt64((pMem->u).r);
    }
  }
  else {
    pMem_local = (Mem *)(pMem->u).pDef;
  }
  return (i64)pMem_local;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(Mem *pMem){
  int flags;
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & MEM_Int ){
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return doubleToInt64(pMem->u.r);
  }else if( flags & (MEM_Str|MEM_Blob) ){
    assert( pMem->z || pMem->n==0 );
    return memIntValue(pMem);
  }else{
    return 0;
  }
}